

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender __thiscall
fmt::v10::detail::write_int<fmt::v10::appender,unsigned__int128,char>
          (detail *this,appender out,unsigned___int128 value,uint prefix,format_specs<char> *specs,
          digit_grouping<char> *grouping)

{
  char cVar1;
  undefined1 n [16];
  undefined1 value_00 [16];
  undefined1 n_00 [16];
  undefined1 value_01 [16];
  undefined1 n_01 [16];
  undefined1 value_02 [16];
  undefined1 n_02 [16];
  undefined1 value_03 [16];
  uint uVar2;
  int value_04;
  type tVar3;
  int iVar4;
  type tVar5;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar6;
  uint uVar7;
  uint uVar8;
  bool upper;
  undefined4 in_register_00000014;
  digit_grouping<char> *in_R9;
  ulong size;
  undefined4 uStack_278;
  uint prefix_local;
  appender local_270;
  digit_grouping<char> *local_268;
  anon_class_24_3_e2c60416 local_260;
  memory_buffer buffer;
  
  uVar8 = (uint)specs;
  buffer.super_buffer<char>.ptr_ = buffer.store_;
  buffer.super_buffer<char>.size_ = 0;
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001d0ca8;
  buffer.super_buffer<char>.capacity_ = 500;
  cVar1 = (char)(grouping->grouping_)._M_string_length;
  iVar4 = (int)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  upper = SUB41(prefix,0);
  prefix_local = uVar8;
  local_270.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)this;
  local_268 = in_R9;
  switch(cVar1) {
  case '\0':
  case '\x01':
    n._4_4_ = uVar8;
    n._0_4_ = uStack_278;
    n._8_8_ = this;
    value_04 = count_digits_fallback<unsigned__int128>
                         ((detail *)
                          out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                          (unsigned___int128)n);
    value_00._4_4_ = prefix_local;
    value_00._0_4_ = uStack_278;
    value_00._8_8_ = local_270.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
    ;
    format_decimal<char,_unsigned___int128,_fmt::v10::appender,_0>
              ((appender)&buffer,(unsigned___int128)value_00,iVar4);
    break;
  case '\x02':
    n_02._4_4_ = uVar8;
    n_02._0_4_ = uStack_278;
    n_02._8_8_ = this;
    value_04 = count_digits<3,unsigned__int128>((unsigned___int128)n_02);
    if (((((grouping->grouping_)._M_string_length & 0x8000) != 0) &&
        (*(int *)((long)&(grouping->grouping_)._M_dataplus._M_p + 4) <= value_04)) &&
       (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container !=
        (buffer<char> *)0x0 || CONCAT44(in_register_00000014,prefix) != 0)) {
      uVar7 = 0x3000;
      if (uVar8 == 0) {
        uVar7 = 0x30;
      }
      uVar8 = (uVar7 | uVar8) + 0x1000000;
      prefix_local = uVar8;
    }
    value_03._4_4_ = prefix_local;
    value_03._0_4_ = uStack_278;
    value_03._8_8_ = local_270.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
    ;
    format_uint<3u,char,fmt::v10::appender,unsigned__int128>
              ((appender)&buffer,(unsigned___int128)value_03,iVar4,upper);
    break;
  case '\x03':
  case '\x04':
    if (((grouping->grouping_)._M_string_length & 0x8000) != 0) {
      uVar2 = (uint)(cVar1 != '\x04') << 0xd | 0x5830;
      uVar7 = uVar2 << 8;
      if (uVar8 == 0) {
        uVar7 = uVar2;
      }
      uVar8 = (uVar7 | uVar8) + 0x2000000;
    }
    n_01._4_4_ = uVar8;
    n_01._0_4_ = uStack_278;
    n_01._8_8_ = this;
    prefix_local = uVar8;
    value_04 = count_digits<4,unsigned__int128>((unsigned___int128)n_01);
    value_02._4_4_ = prefix_local;
    value_02._0_4_ = uStack_278;
    value_02._8_8_ = local_270.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
    ;
    format_uint<4u,char,fmt::v10::appender,unsigned__int128>
              ((appender)&buffer,(unsigned___int128)value_02,iVar4,upper);
    break;
  case '\x05':
  case '\x06':
    if (((grouping->grouping_)._M_string_length & 0x8000) != 0) {
      uVar2 = (uint)(cVar1 != '\x06') << 0xd | 0x4230;
      uVar7 = uVar2 << 8;
      if (uVar8 == 0) {
        uVar7 = uVar2;
      }
      uVar8 = (uVar7 | uVar8) + 0x2000000;
    }
    n_00._4_4_ = uVar8;
    n_00._0_4_ = uStack_278;
    n_00._8_8_ = this;
    prefix_local = uVar8;
    value_04 = count_digits<1,unsigned__int128>((unsigned___int128)n_00);
    value_01._4_4_ = prefix_local;
    value_01._0_4_ = uStack_278;
    value_01._8_8_ = local_270.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
    ;
    format_uint<1u,char,fmt::v10::appender,unsigned__int128>
              ((appender)&buffer,(unsigned___int128)value_01,iVar4,upper);
    break;
  default:
    throw_format_error("invalid format specifier");
  case '\x0f':
    bVar6.container =
         (buffer<char> *)
         write_char<char,fmt::v10::appender>
                   ((appender)this,
                    (char)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                    (format_specs<char> *)grouping);
    goto LAB_00131f47;
  }
  tVar3 = to_unsigned<int>(value_04);
  iVar4 = digit_grouping<char>::count_separators(local_268,value_04);
  tVar5 = to_unsigned<int>(iVar4);
  size = (ulong)((uVar8 >> 0x18) + tVar3 + tVar5);
  local_260.prefix = &prefix_local;
  local_260.grouping = local_268;
  local_260.buffer = &buffer;
  bVar6.container =
       (buffer<char> *)
       write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned__int128,char>(fmt::v10::appender,unsigned__int128,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                 (local_270,(format_specs<char> *)grouping,size,size,&local_260);
LAB_00131f47:
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&buffer);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar6.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}